

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O1

int test_mp_check(void)

{
  int iVar1;
  char *p;
  char *local_28;
  
  _plan(0x47,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check");
  local_28 = anon_var_dwarf_2158 + 1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_2158 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x81\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x559,
      "invalid fixmap 1");
  local_28 = anon_var_dwarf_39e;
  iVar1 = mp_check(&local_28,anon_var_dwarf_39e + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x81\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55a,
      "invalid fixmap 2");
  local_28 = anon_var_dwarf_3d7;
  iVar1 = mp_check(&local_28,anon_var_dwarf_3d7 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x8f\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55b,
      "invalid fixmap 3");
  local_28 = anon_var_dwarf_3f8;
  iVar1 = mp_check(&local_28,anon_var_dwarf_3f8 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x91\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55e,
      "invalid fixarray 1");
  local_28 = anon_var_dwarf_425;
  iVar1 = mp_check(&local_28,anon_var_dwarf_425 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x92\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x55f,
      "invalid fixarray 2");
  local_28 = anon_var_dwarf_446;
  iVar1 = mp_check(&local_28,anon_var_dwarf_446 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x9f\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x560,
      "invalid fixarray 3");
  local_28 = anon_var_dwarf_467;
  iVar1 = mp_check(&local_28,anon_var_dwarf_467 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xa1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x563,
      "invalid fixstr 1");
  local_28 = anon_var_dwarf_488;
  iVar1 = mp_check(&local_28,anon_var_dwarf_488 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xa2\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x564,
      "invalid fixstr 2");
  local_28 = anon_var_dwarf_4a9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_4a9 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xbf\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x565,
      "invalid fixstr 3");
  local_28 = anon_var_dwarf_4ca;
  iVar1 = mp_check(&local_28,anon_var_dwarf_4ca + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc4\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x568,
      "invalid bin8 1");
  local_28 = anon_var_dwarf_4eb;
  iVar1 = mp_check(&local_28,anon_var_dwarf_4eb + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc4\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x569,
      "invalid bin8 2");
  local_28 = anon_var_dwarf_50c;
  iVar1 = mp_check(&local_28,anon_var_dwarf_50c + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x56c,
      "invalid bin16 1");
  local_28 = anon_var_dwarf_539;
  iVar1 = mp_check(&local_28,anon_var_dwarf_539 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc5\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x56d,
      "invalid bin16 2");
  local_28 = anon_var_dwarf_566;
  iVar1 = mp_check(&local_28,anon_var_dwarf_566 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc6\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x570,
      "invalid bin32 1");
  local_28 = anon_var_dwarf_587;
  iVar1 = mp_check(&local_28,anon_var_dwarf_587 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc6\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x571,
      "invalid bin32 2");
  local_28 = anon_var_dwarf_5b4;
  iVar1 = mp_check(&local_28,anon_var_dwarf_5b4 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x574,
      "invalid ext8 1");
  local_28 = anon_var_dwarf_5d5;
  iVar1 = mp_check(&local_28,anon_var_dwarf_5d5 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x575,
      "invalid ext8 2");
  local_28 = anon_var_dwarf_5f6;
  iVar1 = mp_check(&local_28,anon_var_dwarf_5f6 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x576,
      "invalid ext8 3");
  local_28 = anon_var_dwarf_617;
  iVar1 = mp_check(&local_28,anon_var_dwarf_617 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc7\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x577,
      "invalid ext8 4");
  local_28 = anon_var_dwarf_644;
  iVar1 = mp_check(&local_28,anon_var_dwarf_644 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57a,
      "invalid ext16 1");
  local_28 = anon_var_dwarf_665;
  iVar1 = mp_check(&local_28,anon_var_dwarf_665 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57b,
      "invalid ext16 2");
  local_28 = anon_var_dwarf_686;
  iVar1 = mp_check(&local_28,anon_var_dwarf_686 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57c,
      "invalid ext16 3");
  local_28 = anon_var_dwarf_6a7;
  iVar1 = mp_check(&local_28,anon_var_dwarf_6a7 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc8\\x00\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x57d,
      "invalid ext16 4");
  local_28 = anon_var_dwarf_6c8;
  iVar1 = mp_check(&local_28,anon_var_dwarf_6c8 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x580,
      "invalid ext32 1");
  local_28 = anon_var_dwarf_6e9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_6e9 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x581,
      "invalid ext32 2");
  local_28 = anon_var_dwarf_70a;
  iVar1 = mp_check(&local_28,anon_var_dwarf_70a + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x01\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x582,
      "invalid ext32 3");
  local_28 = anon_var_dwarf_737;
  iVar1 = mp_check(&local_28,anon_var_dwarf_737 + 7);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xc9\\x00\\x00\\x00\\x02\\xff\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x583,
      "invalid ext32 4");
  local_28 = anon_var_dwarf_770;
  iVar1 = mp_check(&local_28,anon_var_dwarf_770 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xca\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x586,
      "invalid float32 1");
  local_28 = anon_var_dwarf_791;
  iVar1 = mp_check(&local_28,anon_var_dwarf_791 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xca\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x587,
      "invalid float32 2");
  local_28 = anon_var_dwarf_7b2;
  iVar1 = mp_check(&local_28,anon_var_dwarf_7b2 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcb\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58a,
      "invalid float64 1");
  local_28 = anon_var_dwarf_7d5;
  iVar1 = mp_check(&local_28,anon_var_dwarf_7d5 + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xcb\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58b,
      "invalid float64 2");
  local_28 = anon_var_dwarf_805;
  iVar1 = mp_check(&local_28,anon_var_dwarf_805 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcc\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x58e,
      "invalid uint8 1");
  local_28 = anon_var_dwarf_829;
  iVar1 = mp_check(&local_28,anon_var_dwarf_829 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xcd\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x591,
      "invalid uint16 1");
  local_28 = anon_var_dwarf_84d;
  iVar1 = mp_check(&local_28,anon_var_dwarf_84d + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xce\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x594,
      "invalid uint32 1");
  local_28 = anon_var_dwarf_871;
  iVar1 = mp_check(&local_28,anon_var_dwarf_871 + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xcf\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x597,
      "invalid uint64 1");
  local_28 = anon_var_dwarf_895;
  iVar1 = mp_check(&local_28,anon_var_dwarf_895 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd0\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x59a,
      "invalid int8 1");
  local_28 = anon_var_dwarf_8b9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_8b9 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd1\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x59d,
      "invalid int16 1");
  local_28 = anon_var_dwarf_8dd;
  iVar1 = mp_check(&local_28,anon_var_dwarf_8dd + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd2\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a0,
      "invalid int32 1");
  local_28 = anon_var_dwarf_901;
  iVar1 = mp_check(&local_28,anon_var_dwarf_901 + 8);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd3\\x00\\x00\\x00\\x00\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a3,
      "invalid int64 1");
  local_28 = anon_var_dwarf_925;
  iVar1 = mp_check(&local_28,anon_var_dwarf_925 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a6,
      "invalid fixext8 1");
  local_28 = anon_var_dwarf_949;
  iVar1 = mp_check(&local_28,anon_var_dwarf_949 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd4\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5a7,
      "invalid fixext8 2");
  local_28 = anon_var_dwarf_96d;
  iVar1 = mp_check(&local_28,anon_var_dwarf_96d + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5aa,
      "invalid fixext16 1");
  local_28 = anon_var_dwarf_991;
  iVar1 = mp_check(&local_28,anon_var_dwarf_991 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd5\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5ab,
      "invalid fixext16 2");
  local_28 = anon_var_dwarf_9b5;
  iVar1 = mp_check(&local_28,anon_var_dwarf_9b5 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5ae,
      "invalid fixext32 1");
  local_28 = anon_var_dwarf_9d9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_9d9 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd6\\x00\\x00\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5af,
      "invalid fixext32 2");
  local_28 = anon_var_dwarf_9fd;
  iVar1 = mp_check(&local_28,anon_var_dwarf_9fd + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd7\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b2,
      "invalid fixext64 1");
  local_28 = anon_var_dwarf_a21;
  iVar1 = mp_check(&local_28,anon_var_dwarf_a21 + 9);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd7\\x00\\x00\\x00\\x00\\x00\\x00\\x05\\x05\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b3,
      "invalid fixext64 2");
  local_28 = anon_var_dwarf_a51;
  iVar1 = mp_check(&local_28,anon_var_dwarf_a51 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd8\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b6,
      "invalid fixext128 1");
  local_28 = anon_var_dwarf_a75;
  iVar1 = mp_check(&local_28,anon_var_dwarf_a75 + 0x11);
  _ok((uint)(iVar1 != 0),
      "mp_check(&p, p + sizeof(\"\\xd8\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\\x00\" \"\\x00\\x05\\x05\") - 1) != 0"
      ,"/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5b8
      ,"invalid fixext128 2");
  local_28 = anon_var_dwarf_aa5;
  iVar1 = mp_check(&local_28,anon_var_dwarf_aa5 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd9\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bb,
      "invalid str8 1");
  local_28 = anon_var_dwarf_ac9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_ac9 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xd9\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bc,
      "invalid str8 2");
  local_28 = anon_var_dwarf_aed;
  iVar1 = mp_check(&local_28,anon_var_dwarf_aed + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xda\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5bf,
      "invalid str16 1");
  local_28 = anon_var_dwarf_b11;
  iVar1 = mp_check(&local_28,anon_var_dwarf_b11 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xda\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c0,
      "invalid str16 2");
  local_28 = anon_var_dwarf_b35;
  iVar1 = mp_check(&local_28,anon_var_dwarf_b35 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdb\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c3,
      "invalid str32 1");
  local_28 = anon_var_dwarf_b59;
  iVar1 = mp_check(&local_28,anon_var_dwarf_b59 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdb\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c4,
      "invalid str32 2");
  local_28 = anon_var_dwarf_2c74 + 4;
  iVar1 = mp_check(&local_28,anon_var_dwarf_2c74 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdc\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c7,
      "invalid array16 1");
  local_28 = anon_var_dwarf_ba1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_ba1 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdc\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5c8,
      "invalid array16 2");
  local_28 = anon_var_dwarf_bc5;
  iVar1 = mp_check(&local_28,anon_var_dwarf_bc5 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdd\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cb,
      "invalid array32 1");
  local_28 = anon_var_dwarf_be9;
  iVar1 = mp_check(&local_28,anon_var_dwarf_be9 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdd\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cc,
      "invalid array32 2");
  local_28 = anon_var_dwarf_c0d;
  iVar1 = mp_check(&local_28,anon_var_dwarf_c0d + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5cf,
      "invalid map16 1");
  local_28 = anon_var_dwarf_c31;
  iVar1 = mp_check(&local_28,anon_var_dwarf_c31 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d0,
      "invalid map16 2");
  local_28 = anon_var_dwarf_c55;
  iVar1 = mp_check(&local_28,anon_var_dwarf_c55 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x00\\x01\\x5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d1,
      "invalid map16 3");
  local_28 = anon_var_dwarf_c85;
  iVar1 = mp_check(&local_28,anon_var_dwarf_c85 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xde\\x80\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d2,
      "invalid map16 4");
  local_28 = anon_var_dwarf_20b0 + 1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_20b0 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d5,
      "invalid map32 1");
  local_28 = anon_var_dwarf_ccd;
  iVar1 = mp_check(&local_28,anon_var_dwarf_ccd + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x00\\x00\\x00\\x01\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d6,
      "invalid map32 2");
  local_28 = anon_var_dwarf_cf1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_cf1 + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x00\\x00\\x00\\x01\\x5\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d7,
      "invalid map32 3");
  local_28 = anon_var_dwarf_d21;
  iVar1 = mp_check(&local_28,anon_var_dwarf_d21 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xdf\\x80\\x00\\x00\\x00\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5d8,
      "invalid map32 4");
  local_28 = anon_var_dwarf_8a7c + 2;
  iVar1 = mp_check(&local_28,anon_var_dwarf_8a7c + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\xc1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5db,
      "invalid header 1");
  local_28 = anon_var_dwarf_8a7c + 1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_8a7c + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x91\\xc1\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5dc,
      "invalid header 2");
  local_28 = anon_var_dwarf_d8d;
  iVar1 = mp_check(&local_28,anon_var_dwarf_d8d + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x93\\xff\\xc1\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5dd,
      "invalid header 3");
  local_28 = anon_var_dwarf_db1;
  iVar1 = mp_check(&local_28,anon_var_dwarf_db1 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, p + sizeof(\"\\x82\\xff\\xc1\\xff\\xff\") - 1) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x5de,
      "invalid header 4");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

int
test_mp_check()
{
	plan(71);
	header();

#define invalid(data, fmt, ...) ({ \
	const char *p = data; \
	isnt(mp_check(&p, p + sizeof(data) - 1), 0, fmt, ## __VA_ARGS__); \
})

	/* fixmap */
	invalid("\x81", "invalid fixmap 1");
	invalid("\x81\x01", "invalid fixmap 2");
	invalid("\x8f\x01", "invalid fixmap 3");

	/* fixarray */
	invalid("\x91", "invalid fixarray 1");
	invalid("\x92\x01", "invalid fixarray 2");
	invalid("\x9f\x01", "invalid fixarray 3");

	/* fixstr */
	invalid("\xa1", "invalid fixstr 1");
	invalid("\xa2\x00", "invalid fixstr 2");
	invalid("\xbf\x00", "invalid fixstr 3");

	/* bin8 */
	invalid("\xc4", "invalid bin8 1");
	invalid("\xc4\x01", "invalid bin8 2");

	/* bin16 */
	invalid("\xc5", "invalid bin16 1");
	invalid("\xc5\x00\x01", "invalid bin16 2");

	/* bin32 */
	invalid("\xc6", "invalid bin32 1");
	invalid("\xc6\x00\x00\x00\x01", "invalid bin32 2");

	/* ext8 */
	invalid("\xc7", "invalid ext8 1");
	invalid("\xc7\x00", "invalid ext8 2");
	invalid("\xc7\x01\xff", "invalid ext8 3");
	invalid("\xc7\x02\xff\x00", "invalid ext8 4");

	/* ext16 */
	invalid("\xc8", "invalid ext16 1");
	invalid("\xc8\x00\x00", "invalid ext16 2");
	invalid("\xc8\x00\x01\xff", "invalid ext16 3");
	invalid("\xc8\x00\x02\xff\x00", "invalid ext16 4");

	/* ext32 */
	invalid("\xc9", "invalid ext32 1");
	invalid("\xc9\x00\x00\x00\x00", "invalid ext32 2");
	invalid("\xc9\x00\x00\x00\x01\xff", "invalid ext32 3");
	invalid("\xc9\x00\x00\x00\x02\xff\x00", "invalid ext32 4");

	/* float32 */
	invalid("\xca", "invalid float32 1");
	invalid("\xca\x00\x00\x00", "invalid float32 2");

	/* float64 */
	invalid("\xcb", "invalid float64 1");
	invalid("\xcb\x00\x00\x00\x00\x00\x00\x00", "invalid float64 2");

	/* uint8 */
	invalid("\xcc", "invalid uint8 1");

	/* uint16 */
	invalid("\xcd\x00", "invalid uint16 1");

	/* uint32 */
	invalid("\xce\x00\x00\x00", "invalid uint32 1");

	/* uint64 */
	invalid("\xcf\x00\x00\x00\x00\x00\x00\x00", "invalid uint64 1");

	/* int8 */
	invalid("\xd0", "invalid int8 1");

	/* int16 */
	invalid("\xd1\x00", "invalid int16 1");

	/* int32 */
	invalid("\xd2\x00\x00\x00", "invalid int32 1");

	/* int64 */
	invalid("\xd3\x00\x00\x00\x00\x00\x00\x00", "invalid int64 1");

	/* fixext8 */
	invalid("\xd4", "invalid fixext8 1");
	invalid("\xd4\x05", "invalid fixext8 2");

	/* fixext16 */
	invalid("\xd5", "invalid fixext16 1");
	invalid("\xd5\x05\x05", "invalid fixext16 2");

	/* fixext32 */
	invalid("\xd6", "invalid fixext32 1");
	invalid("\xd6\x00\x00\x05\x05", "invalid fixext32 2");

	/* fixext64 */
	invalid("\xd7", "invalid fixext64 1");
	invalid("\xd7\x00\x00\x00\x00\x00\x00\x05\x05", "invalid fixext64 2");

	/* fixext128 */
	invalid("\xd8", "invalid fixext128 1");
	invalid("\xd8\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00\x00"
		"\x00\x05\x05", "invalid fixext128 2");

	/* str8 */
	invalid("\xd9", "invalid str8 1");
	invalid("\xd9\x01", "invalid str8 2");

	/* str16 */
	invalid("\xda", "invalid str16 1");
	invalid("\xda\x00\x01", "invalid str16 2");

	/* str32 */
	invalid("\xdb", "invalid str32 1");
	invalid("\xdb\x00\x00\x00\x01", "invalid str32 2");

	/* array16 */
	invalid("\xdc", "invalid array16 1");
	invalid("\xdc\x00\x01", "invalid array16 2");

	/* array32 */
	invalid("\xdd", "invalid array32 1");
	invalid("\xdd\x00\x00\x00\x01", "invalid array32 2");

	/* map16 */
	invalid("\xde", "invalid map16 1");
	invalid("\xde\x00\x01", "invalid map16 2");
	invalid("\xde\x00\x01\x5", "invalid map16 3");
	invalid("\xde\x80\x00", "invalid map16 4");

	/* map32 */
	invalid("\xdf", "invalid map32 1");
	invalid("\xdf\x00\x00\x00\x01", "invalid map32 2");
	invalid("\xdf\x00\x00\x00\x01\x5", "invalid map32 3");
	invalid("\xdf\x80\x00\x00\x00", "invalid map32 4");

	/* 0xc1 is never used */
	invalid("\xc1", "invalid header 1");
	invalid("\x91\xc1", "invalid header 2");
	invalid("\x93\xff\xc1\xff", "invalid header 3");
	invalid("\x82\xff\xc1\xff\xff", "invalid header 4");

#undef invalid

	footer();

	return check_plan();
}